

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitTypeTraitExpression(SyntaxDumper *this,TypeTraitExpressionSyntax *node)

{
  TypeReferenceSyntax *pTVar1;
  SyntaxToken local_50;
  TypeTraitExpressionSyntax *local_18;
  TypeTraitExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (TypeTraitExpressionSyntax *)this;
  traverseExpression(this,&node->super_ExpressionSyntax);
  TypeTraitExpressionSyntax::operatorToken(&local_50,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pTVar1 = TypeTraitExpressionSyntax::tyReference(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pTVar1);
  return Skip;
}

Assistant:

virtual Action visitTypeTraitExpression(const TypeTraitExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->operatorToken(), node);
        nonterminal(node->tyReference());
        return Action::Skip;
    }